

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O0

int si9ma::BinarySearch::find_local_min(int *arr,int L,int R)

{
  code *pcVar1;
  undefined8 *puVar2;
  int local_20;
  int mid;
  int R_local;
  int L_local;
  int *arr_local;
  
  if (R < L) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "invalid length";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  arr_local._4_4_ = L;
  if (((L != R) && (arr[L + 1] <= arr[L])) &&
     (local_20 = R, mid = L, arr_local._4_4_ = R, arr[R + -1] <= arr[R])) {
    while( true ) {
      if (local_20 < mid) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      arr_local._4_4_ = mid + (local_20 - mid) / 2;
      if ((arr[arr_local._4_4_] < arr[arr_local._4_4_ + -1]) &&
         (arr[arr_local._4_4_] < arr[arr_local._4_4_ + 1])) break;
      if (arr[arr_local._4_4_ + -1] < arr[arr_local._4_4_]) {
        local_20 = arr_local._4_4_ + -1;
      }
      else {
        mid = arr_local._4_4_ + 1;
      }
    }
  }
  return arr_local._4_4_;
}

Assistant:

int BinarySearch::find_local_min(int *arr, int L,int R) {
        if(R < L)
            throw "invalid length";

        if(L == R)
            return L;

        if(arr[L] < arr[L + 1])
            return L;

        if(arr[R] < arr[R - 1])
            return R;

        while (L <= R){
            int mid = L + (R - L)/2;

            if(arr[mid] < arr[mid - 1] && arr[mid] < arr[mid + 1])
                return mid;

            if(arr[mid] > arr[mid - 1]){
                R = mid - 1;
                continue;
            }

            L = mid + 1;
        }
    }